

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-ni.c
# Opt level: O0

ssh_cipher * aes_ni_new(ssh_cipheralg *alg)

{
  _Bool _Var1;
  void *pvVar2;
  ulong uVar3;
  aes_ni_context *ctx;
  uintptr_t aligned_address;
  uintptr_t alloc_address;
  void *allocation;
  aes_extra *extra;
  ssh_cipheralg *alg_local;
  
  _Var1 = check_availability((aes_extra *)alg->extra);
  if (_Var1) {
    pvVar2 = safemalloc(0x20f,1,0);
    uVar3 = (long)pvVar2 + 0xfU & 0xfffffffffffffff0;
    *(ssh_cipheralg **)(uVar3 + 0x1f8) = alg;
    *(void **)(uVar3 + 0x1f0) = pvVar2;
    alg_local = (ssh_cipheralg *)(uVar3 + 0x1f8);
  }
  else {
    alg_local = (ssh_cipheralg *)0x0;
  }
  return (ssh_cipher *)alg_local;
}

Assistant:

static ssh_cipher *aes_ni_new(const ssh_cipheralg *alg)
{
    const struct aes_extra *extra = (const struct aes_extra *)alg->extra;
    if (!check_availability(extra))
        return NULL;

    /*
     * The __m128i variables in the context structure need to be
     * 16-byte aligned, but not all malloc implementations that this
     * code has to work with will guarantee to return a 16-byte
     * aligned pointer. So we over-allocate, manually realign the
     * pointer ourselves, and store the original one inside the
     * context so we know how to free it later.
     */
    void *allocation = smalloc(sizeof(aes_ni_context) + 15);
    uintptr_t alloc_address = (uintptr_t)allocation;
    uintptr_t aligned_address = (alloc_address + 15) & ~15;
    aes_ni_context *ctx = (aes_ni_context *)aligned_address;

    ctx->ciph.vt = alg;
    ctx->pointer_to_free = allocation;
    return &ctx->ciph;
}